

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

int __thiscall QPainterState::init(QPainterState *this,EVP_PKEY_CTX *ctx)

{
  LayoutDirection LVar1;
  long in_FS_OFFSET;
  QFont *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  QFont *this_00;
  QBrush *in_stack_ffffffffffffff78;
  QFont *in_stack_ffffffffffffff88;
  QRegion local_40 [2];
  QPointF local_30;
  QFont local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBrush::operator=(in_stack_ffffffffffffff78,
                    (GlobalColor)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  this->bgMode = TransparentMode;
  this->field_0x1a0 = this->field_0x1a0 & 0xfe;
  this->field_0x1a0 = this->field_0x1a0 & 0xfd;
  this->field_0x1a0 = this->field_0x1a0 | 4;
  this->wh = 0;
  this->ww = 0;
  this->wy = 0;
  this->wx = 0;
  this->vh = 0;
  this->vw = 0;
  this->vy = 0;
  this->vx = 0;
  this->painter = (QPainter *)ctx;
  this_00 = &local_20;
  QPen::QPen((QPen *)this_00);
  QPen::operator=((QPen *)this_00,(QPen *)in_stack_ffffffffffffff68);
  QPen::~QPen((QPen *)0x5a4f72);
  QPointF::QPointF(&local_30,0.0,0.0);
  (this->brushOrigin).xp = local_30.xp;
  (this->brushOrigin).yp = local_30.yp;
  QBrush::QBrush((QBrush *)this_00);
  QBrush::operator=((QBrush *)this_00,(QBrush *)in_stack_ffffffffffffff68);
  QBrush::~QBrush((QBrush *)0x5a4fbc);
  QFont::QFont(in_stack_ffffffffffffff88);
  QFont::operator=(this_00,in_stack_ffffffffffffff68);
  QFont::operator=(this_00,in_stack_ffffffffffffff68);
  QFont::~QFont((QFont *)0x5a4ffc);
  QRegion::QRegion(local_40);
  QRegion::operator=((QRegion *)this_00,(QRegion *)in_stack_ffffffffffffff68);
  QRegion::~QRegion((QRegion *)this_00);
  QPainterPath::QPainterPath((QPainterPath *)0x5a5037);
  QPainterPath::operator=((QPainterPath *)this_00,(QPainterPath *)in_stack_ffffffffffffff68);
  QPainterPath::~QPainterPath((QPainterPath *)0x5a5054);
  this->clipOperation = NoClip;
  QList<QPainterClipInfo>::clear((QList<QPainterClipInfo> *)this_00);
  QTransform::reset((QTransform *)in_stack_ffffffffffffff68);
  QTransform::reset((QTransform *)in_stack_ffffffffffffff68);
  LVar1 = QGuiApplication::layoutDirection();
  this->layoutDirection = LVar1;
  this->composition_mode = CompositionMode_SourceOver;
  this->emulationSpecifier = 0;
  QFlags<QPaintEngine::DirtyFlag>::QFlags((QFlags<QPaintEngine::DirtyFlag> *)0x5a50c3);
  (this->super_QPaintEngineState).dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
  super_QFlagsStorage<QPaintEngine::DirtyFlag>.i = 0;
  this->changeFlags = 0;
  QFlags<QPainter::RenderHint>::QFlags((QFlags<QPainter::RenderHint> *)0x5a50eb);
  (this->renderHints).super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
  super_QFlagsStorage<QPainter::RenderHint>.i = 0;
  this->opacity = 1.0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QPainterState::init(QPainter *p) {
    bgBrush = Qt::white;
    bgMode = Qt::TransparentMode;
    WxF = false;
    VxF = false;
    clipEnabled = true;
    wx = wy = ww = wh = 0;
    vx = vy = vw = vh = 0;
    painter = p;
    pen = QPen();
    brushOrigin = QPointF(0, 0);
    brush = QBrush();
    font = deviceFont = QFont();
    clipRegion = QRegion();
    clipPath = QPainterPath();
    clipOperation = Qt::NoClip;
    clipInfo.clear();
    worldMatrix.reset();
    matrix.reset();
    layoutDirection = QGuiApplication::layoutDirection();
    composition_mode = QPainter::CompositionMode_SourceOver;
    emulationSpecifier = 0;
    dirtyFlags = { };
    changeFlags = 0;
    renderHints = { };
    opacity = 1;
}